

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utPretransformVertices.cpp
# Opt level: O3

void __thiscall PretransformVerticesTest::SetUp(PretransformVerticesTest *this)

{
  float fVar1;
  undefined8 uVar2;
  uint uVar3;
  aiScene *this_00;
  aiMaterial **ppaVar4;
  aiMaterial *this_01;
  aiMesh **ppaVar5;
  aiMesh *paVar6;
  long *plVar7;
  aiVector3D *paVar8;
  undefined4 *puVar9;
  aiNode *paVar10;
  PretransformVertices *this_02;
  uint normalIdx;
  aiFace *paVar11;
  uint i;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  int local_48;
  
  this_00 = (aiScene *)operator_new(0x80);
  aiScene::aiScene(this_00);
  this->mScene = this_00;
  this_00->mNumMaterials = 5;
  ppaVar4 = (aiMaterial **)operator_new__(0x28);
  this_00->mMaterials = ppaVar4;
  lVar12 = 0;
  do {
    this_01 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_01);
    this->mScene->mMaterials[lVar12] = this_01;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 5);
  this->mScene->mNumMeshes = 0x19;
  ppaVar5 = (aiMesh **)operator_new__(200);
  this->mScene->mMeshes = ppaVar5;
  uVar14 = 0;
  do {
    paVar6 = (aiMesh *)operator_new(0x520);
    paVar6->mPrimitiveTypes = 0;
    paVar6->mNumVertices = 0;
    paVar6->mNumFaces = 0;
    memset(&paVar6->mVertices,0,0xcc);
    paVar6->mBones = (aiBone **)0x0;
    paVar6->mMaterialIndex = 0;
    (paVar6->mName).length = 0;
    (paVar6->mName).data[0] = '\0';
    memset((paVar6->mName).data + 1,0x1b,0x3ff);
    paVar6->mNumAnimMeshes = 0;
    paVar6->mAnimMeshes = (aiAnimMesh **)0x0;
    paVar6->mMethod = 0;
    (paVar6->mAABB).mMin.x = 0.0;
    (paVar6->mAABB).mMin.y = 0.0;
    (paVar6->mAABB).mMin.z = 0.0;
    (paVar6->mAABB).mMax.x = 0.0;
    (paVar6->mAABB).mMax.y = 0.0;
    (paVar6->mAABB).mMax.z = 0.0;
    memset(paVar6->mColors,0,0xa0);
    this->mScene->mMeshes[uVar14] = paVar6;
    paVar6->mPrimitiveTypes = 1;
    lVar12 = uVar14 + 10;
    paVar6->mNumFaces = (uint)lVar12;
    plVar7 = (long *)operator_new__(lVar12 * 0x10 + 8);
    *plVar7 = lVar12;
    paVar11 = (aiFace *)(plVar7 + 1);
    do {
      paVar11->mNumIndices = 0;
      paVar11->mIndices = (uint *)0x0;
      paVar11 = paVar11 + 1;
    } while (paVar11 != (aiFace *)(plVar7 + lVar12 * 2 + 1));
    paVar6->mFaces = (aiFace *)(plVar7 + 1);
    paVar6->mNumVertices = (uint)lVar12;
    paVar8 = (aiVector3D *)operator_new__(lVar12 * 0xc);
    memset(paVar8,0,uVar14 * 0xc + 0x78);
    local_48 = (int)uVar14;
    paVar6->mVertices = paVar8;
    lVar15 = 2;
    lVar12 = 0;
    uVar13 = 0;
    do {
      paVar11 = paVar6->mFaces;
      *(undefined4 *)((long)paVar11 + lVar15 * 4 + -8) = 1;
      puVar9 = (undefined4 *)operator_new__(4);
      *(undefined4 **)(&paVar11->mNumIndices + lVar15) = puVar9;
      *puVar9 = (int)lVar12;
      paVar8 = paVar6->mVertices;
      (&paVar8->x)[lVar12] = (float)local_48;
      (&paVar8->y)[lVar12] = (float)(uVar13 & 0xffffffff);
      (&paVar8->z)[lVar12] = 0.0;
      uVar13 = uVar13 + 1;
      lVar12 = lVar12 + 3;
      lVar15 = lVar15 + 4;
    } while (uVar13 < paVar6->mNumFaces);
    paVar6->mMaterialIndex = local_48 + (int)((uVar14 & 0xffffffff) / 5) * -5;
    if ((uVar14 & 1) != 0) {
      uVar3 = paVar6->mNumVertices;
      uVar13 = (ulong)uVar3 * 0xc;
      paVar8 = (aiVector3D *)operator_new__(uVar13);
      if ((ulong)uVar3 == 0) {
        paVar6->mNormals = paVar8;
      }
      else {
        memset(paVar8,0,((uVar13 - 0xc) / 0xc) * 0xc + 0xc);
        paVar6->mNormals = paVar8;
        lVar12 = 0;
        uVar13 = 0;
        do {
          *(undefined4 *)((long)&paVar6->mNormals->x + lVar12) = 0x3f800000;
          *(undefined4 *)((long)&paVar6->mNormals->y + lVar12) = 0x3f800000;
          *(undefined4 *)((long)&paVar6->mNormals->z + lVar12) = 0x3f800000;
          paVar8 = paVar6->mNormals;
          fVar1 = *(float *)((long)&paVar8->z + lVar12);
          uVar2 = *(undefined8 *)((long)&paVar8->x + lVar12);
          fVar16 = (float)uVar2;
          fVar17 = (float)((ulong)uVar2 >> 0x20);
          fVar18 = 1.0 / SQRT(fVar1 * fVar1 + fVar16 * fVar16 + fVar17 * fVar17);
          *(ulong *)((long)&paVar8->x + lVar12) = CONCAT44(fVar18 * fVar17,fVar18 * fVar16);
          *(float *)((long)&paVar8->z + lVar12) = fVar1 * fVar18;
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0xc;
        } while (uVar13 < paVar6->mNumVertices);
      }
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x19);
  paVar10 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar10);
  this->mScene->mRootNode = paVar10;
  paVar10 = this->mScene->mRootNode;
  (paVar10->mName).length = 4;
  builtin_strncpy((paVar10->mName).data,"Root",5);
  AddNodes(0,this->mScene->mRootNode,2);
  this_02 = (PretransformVertices *)operator_new(0x60);
  Assimp::PretransformVertices::PretransformVertices(this_02);
  this->mProcess = this_02;
  return;
}

Assistant:

void PretransformVerticesTest::SetUp() {
    mScene = new aiScene();

    // add 5 empty materials
    mScene->mMaterials = new aiMaterial*[mScene->mNumMaterials = 5];
    for (unsigned int i = 0; i < 5;++i) {
        mScene->mMaterials[i] = new aiMaterial();
    }

    // add 25 test meshes
    mScene->mMeshes = new aiMesh*[mScene->mNumMeshes = 25];
    for ( unsigned int i = 0; i < 25; ++i) { 
        aiMesh* mesh = mScene->mMeshes[ i ] = new aiMesh();

        mesh->mPrimitiveTypes = aiPrimitiveType_POINT;
        mesh->mFaces = new aiFace[ mesh->mNumFaces = 10+i ];
        mesh->mVertices = new aiVector3D[mesh->mNumVertices = mesh->mNumFaces];
        for (unsigned int a = 0; a < mesh->mNumFaces; ++a ) {
            aiFace& f = mesh->mFaces[ a ];
            f.mIndices = new unsigned int [ f.mNumIndices = 1 ];
            f.mIndices[0] = a*3;

            mesh->mVertices[a] = aiVector3D((float)i,(float)a,0.f);
        }
        mesh->mMaterialIndex = i%5;

        if (i % 2) {
            mesh->mNormals = new aiVector3D[mesh->mNumVertices];
            for ( unsigned int normalIdx=0; normalIdx<mesh->mNumVertices; ++normalIdx ) {
                mesh->mNormals[ normalIdx ].x = 1.0f;
                mesh->mNormals[ normalIdx ].y = 1.0f;
                mesh->mNormals[ normalIdx ].z = 1.0f;
                mesh->mNormals[ normalIdx ].Normalize();
            }
        }
    }

    // construct some nodes (1+25)
    mScene->mRootNode = new aiNode();
    mScene->mRootNode->mName.Set("Root");
    AddNodes(0, mScene->mRootNode, 2);

    mProcess = new PretransformVertices();
}